

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void upb::generator::WriteMiniTableMultipleSources
               (DefPoolPair *pools,FileDefPtr file,MiniTableOptions *options,
               GeneratorContext *context)

{
  pointer pMVar1;
  bool bVar2;
  int iVar3;
  reference pMVar4;
  reference pEVar5;
  reference pFVar6;
  char *pcVar7;
  ZeroCopyOutputStream *pZVar8;
  pointer pZVar9;
  LogMessage *pLVar10;
  int *in_R9;
  string_view sVar11;
  string_view full_name;
  string_view full_name_00;
  LogMessage local_308;
  Voidify local_2f1;
  string_view local_2f0;
  Cord local_2e0;
  basic_string_view<char,_std::char_traits<char>_> local_2d0;
  upb_FileDef *local_2c0;
  string local_2b8;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_298;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  stream_2;
  undefined1 local_280 [8];
  Output output_2;
  FieldDefPtr ext;
  iterator __end2_2;
  iterator __begin2_2;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *__range2_2;
  LogMessage local_238;
  Voidify local_221;
  string_view local_220;
  Cord local_210;
  basic_string_view<char,_std::char_traits<char>_> local_200;
  upb_FileDef *local_1f0;
  string local_1e8;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_1c8;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  stream_1;
  undefined1 local_1b0 [8];
  Output output_1;
  EnumDefPtr e;
  iterator __end2_1;
  iterator __begin2_1;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *__range2_1;
  LogMessage local_168;
  Voidify local_151;
  string_view local_150;
  Cord local_140;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  upb_FileDef *local_120;
  string local_118;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_f8;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  stream;
  undefined1 local_e0 [8];
  Output output;
  MessageDefPtr message;
  iterator __end2;
  iterator __begin2;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *__range2;
  FileDefPtr FStack_98;
  int i;
  undefined1 local_90 [8];
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> enums;
  undefined1 local_60 [8];
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> extensions;
  undefined1 local_40 [8];
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> messages;
  GeneratorContext *context_local;
  MiniTableOptions *options_local;
  DefPoolPair *pools_local;
  FileDefPtr file_local;
  
  extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)file.ptr_;
  messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context;
  SortedMessages((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_40,file);
  SortedExtensions((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_60,file);
  FStack_98.ptr_ = file.ptr_;
  SortedEnums((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_90,file,
              kClosedEnums);
  __range2._4_4_ = 0;
  __end2 = std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::begin
                     ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_40);
  message.ptr_ = (upb_MessageDef *)
                 std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::end
                           ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)
                            local_40);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
                                *)&message);
    if (!bVar2) {
      __end2_1 = std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::begin
                           ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_90);
      e.ptr_ = (upb_EnumDef *)
               std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::end
                         ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_90);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2_1,
                           (__normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
                            *)&e);
        if (!bVar2) {
          __end2_2 = std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::begin
                               ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)
                                local_60);
          ext.ptr_ = (upb_FieldDef *)
                     std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::end
                               ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)
                                local_60);
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              (&__end2_2,
                               (__normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
                                *)&ext);
            if (!bVar2) {
              std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::~vector
                        ((vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)local_90);
              std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::~vector
                        ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)local_60);
              std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::~vector
                        ((vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)local_40
                        );
              return;
            }
            pFVar6 = __gnu_cxx::
                     __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
                     ::operator*(&__end2_2);
            output_2.output_.field_2._8_8_ = pFVar6->ptr_;
            Output::Output((Output *)local_280);
            WriteMiniTableSourceIncludes(file,options,(Output *)local_280);
            stream_2._M_t.
            super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
            .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl
                 = (__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
                    )(__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
                      )output_2.output_.field_2._8_8_;
            anon_unknown_5::WriteExtension
                      (pools,(FieldDefPtr)output_2.output_.field_2._8_8_,(Output *)local_280);
            pMVar1 = messages.
                     super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_2c0 = file.ptr_;
            pcVar7 = FieldDefPtr::full_name((FieldDefPtr *)((long)&output_2.output_.field_2 + 8));
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_2d0,pcVar7);
            sVar11._M_str = (char *)((long)&__range2 + 4);
            sVar11._M_len = (size_t)local_2d0._M_str;
            MultipleSourceFilename_abi_cxx11_
                      (&local_2b8,(generator *)local_2c0,(FileDefPtr)local_2d0._M_len,sVar11,in_R9);
            pZVar8 = (ZeroCopyOutputStream *)(*(code *)pMVar1->ptr_->layout)(pMVar1,&local_2b8);
            absl::lts_20250127::WrapUnique<google::protobuf::io::ZeroCopyOutputStream>
                      ((lts_20250127 *)&local_298,pZVar8);
            std::__cxx11::string::~string((string *)&local_2b8);
            pZVar9 = std::
                     unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     ::operator->(&local_298);
            sVar11 = Output::output((Output *)local_280);
            local_2f0 = sVar11;
            absl::lts_20250127::Cord::Cord(&local_2e0,sVar11);
            iVar3 = (*pZVar9->_vptr_ZeroCopyOutputStream[7])(pZVar9,&local_2e0);
            if ((((byte)iVar3 ^ 0xff) & 1) != 0) break;
            absl::lts_20250127::Cord::~Cord(&local_2e0);
            std::
            unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
            ::~unique_ptr(&local_298);
            Output::~Output((Output *)local_280);
            __gnu_cxx::
            __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
            ::operator++(&__end2_2);
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_308,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/minitable/generator.cc"
                     ,0x1d6,"stream->WriteCord(absl::Cord(output.output()))");
          pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_308);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_2f1,pLVar10);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_308);
        }
        pEVar5 = __gnu_cxx::
                 __normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
                 ::operator*(&__end2_1);
        output_1.output_.field_2._8_8_ = pEVar5->ptr_;
        Output::Output((Output *)local_1b0);
        WriteMiniTableSourceIncludes(file,options,(Output *)local_1b0);
        stream_1._M_t.
        super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl =
             (__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
              )(__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
                )output_1.output_.field_2._8_8_;
        anon_unknown_5::WriteEnum((EnumDefPtr)output_1.output_.field_2._8_8_,(Output *)local_1b0);
        pMVar1 = messages.
                 super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
        local_1f0 = file.ptr_;
        pcVar7 = EnumDefPtr::full_name((EnumDefPtr *)((long)&output_1.output_.field_2 + 8));
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_200,pcVar7);
        full_name_00._M_str = (char *)((long)&__range2 + 4);
        full_name_00._M_len = (size_t)local_200._M_str;
        MultipleSourceFilename_abi_cxx11_
                  (&local_1e8,(generator *)local_1f0,(FileDefPtr)local_200._M_len,full_name_00,in_R9
                  );
        pZVar8 = (ZeroCopyOutputStream *)(*(code *)pMVar1->ptr_->layout)(pMVar1,&local_1e8);
        absl::lts_20250127::WrapUnique<google::protobuf::io::ZeroCopyOutputStream>
                  ((lts_20250127 *)&local_1c8,pZVar8);
        std::__cxx11::string::~string((string *)&local_1e8);
        pZVar9 = std::
                 unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 ::operator->(&local_1c8);
        sVar11 = Output::output((Output *)local_1b0);
        local_220 = sVar11;
        absl::lts_20250127::Cord::Cord(&local_210,sVar11);
        iVar3 = (*pZVar9->_vptr_ZeroCopyOutputStream[7])(pZVar9,&local_210);
        if ((((byte)iVar3 ^ 0xff) & 1) != 0) break;
        absl::lts_20250127::Cord::~Cord(&local_210);
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ::~unique_ptr(&local_1c8);
        Output::~Output((Output *)local_1b0);
        __gnu_cxx::
        __normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
        ::operator++(&__end2_1);
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_238,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/minitable/generator.cc"
                 ,0x1ce,"stream->WriteCord(absl::Cord(output.output()))");
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_238);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_221,pLVar10);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_238);
    }
    pMVar4 = __gnu_cxx::
             __normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
             ::operator*(&__end2);
    output.output_.field_2._8_8_ = pMVar4->ptr_;
    Output::Output((Output *)local_e0);
    WriteMiniTableSourceIncludes(file,options,(Output *)local_e0);
    stream._M_t.
    super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl =
         (__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
          )(__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
            )output.output_.field_2._8_8_;
    anon_unknown_5::WriteMessage
              ((MessageDefPtr)output.output_.field_2._8_8_,pools,options,(Output *)local_e0);
    pMVar1 = messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_120 = file.ptr_;
    pcVar7 = MessageDefPtr::full_name((MessageDefPtr *)((long)&output.output_.field_2 + 8));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,pcVar7);
    full_name._M_str = (char *)((long)&__range2 + 4);
    full_name._M_len = (size_t)local_130._M_str;
    MultipleSourceFilename_abi_cxx11_
              (&local_118,(generator *)local_120,(FileDefPtr)local_130._M_len,full_name,in_R9);
    pZVar8 = (ZeroCopyOutputStream *)(*(code *)pMVar1->ptr_->layout)(pMVar1,&local_118);
    absl::lts_20250127::WrapUnique<google::protobuf::io::ZeroCopyOutputStream>
              ((lts_20250127 *)&local_f8,pZVar8);
    std::__cxx11::string::~string((string *)&local_118);
    pZVar9 = std::
             unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             ::operator->(&local_f8);
    sVar11 = Output::output((Output *)local_e0);
    local_150 = sVar11;
    absl::lts_20250127::Cord::Cord(&local_140,sVar11);
    iVar3 = (*pZVar9->_vptr_ZeroCopyOutputStream[7])(pZVar9,&local_140);
    if ((((byte)iVar3 ^ 0xff) & 1) != 0) break;
    absl::lts_20250127::Cord::~Cord(&local_140);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::~unique_ptr(&local_f8);
    Output::~Output((Output *)local_e0);
    __gnu_cxx::
    __normal_iterator<upb::MessageDefPtr_*,_std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>_>
    ::operator++(&__end2);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_168,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/minitable/generator.cc"
             ,0x1c6,"stream->WriteCord(absl::Cord(output.output()))");
  pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_168);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_151,pLVar10);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_168)
  ;
}

Assistant:

void WriteMiniTableMultipleSources(
    const DefPoolPair& pools, upb::FileDefPtr file,
    const MiniTableOptions& options,
    google::protobuf::compiler::GeneratorContext* context) {
  std::vector<upb::MessageDefPtr> messages = SortedMessages(file);
  std::vector<upb::FieldDefPtr> extensions = SortedExtensions(file);
  std::vector<upb::EnumDefPtr> enums = SortedEnums(file, kClosedEnums);
  int i = 0;

  for (auto message : messages) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteMessage(message, pools, options, output);
    auto stream = absl::WrapUnique(
        context->Open(MultipleSourceFilename(file, message.full_name(), &i)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(output.output())));
  }
  for (const auto e : enums) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteEnum(e, output);
    auto stream = absl::WrapUnique(
        context->Open(MultipleSourceFilename(file, e.full_name(), &i)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(output.output())));
  }
  for (const auto ext : extensions) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteExtension(pools, ext, output);
    auto stream = absl::WrapUnique(
        context->Open(MultipleSourceFilename(file, ext.full_name(), &i)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(output.output())));
  }
}